

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> __thiscall
anon_unknown.dwarf_35995e::BuildSystemEngineDelegate::lookupRule
          (BuildSystemEngineDelegate *this,KeyType *keyData)

{
  NodeType NVar1;
  uint uVar2;
  long lVar3;
  void *pvVar4;
  StatNode *__ptr;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  CommandSignature CVar9;
  Kind KVar10;
  int iVar11;
  char *pcVar12;
  BuildNode *this_00;
  ulong uVar13;
  long *plVar14;
  BuildSystemRule *pBVar15;
  long lVar16;
  iterator iVar17;
  default_delete<llbuild::buildsystem::StatNode> *this_01;
  code *pcVar18;
  KeyType *in_RDX;
  long *plVar19;
  CommandSignature CVar20;
  _Any_data *p_Var21;
  pointer pcVar22;
  size_type sVar23;
  size_type *this_02;
  StringRef SVar24;
  string path_1;
  string path;
  string filters;
  BuildKey key;
  undefined1 local_6f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d0;
  undefined1 local_6c0;
  undefined7 uStack_6bf;
  ulong uStack_6b8;
  CommandSignature local_6b0;
  long local_6a8;
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  long local_680;
  undefined1 local_678;
  undefined7 uStack_677;
  long lStack_670;
  _Head_base<0UL,_llbuild::core::Rule_*,_false> local_668;
  BuildKey local_660;
  KeyType *local_640;
  _Any_data local_638;
  code *local_628;
  code *local_620;
  _Any_data local_618;
  code *local_608;
  code *pcStack_600;
  _Any_data local_5f8;
  code *local_5e8;
  code *pcStack_5e0;
  _Any_data local_5d8;
  code *local_5c8;
  code *pcStack_5c0;
  _Any_data local_5b8;
  code *local_5a8;
  code *local_5a0;
  _Any_data local_598;
  code *local_588;
  undefined8 uStack_580;
  _Any_data local_578;
  code *local_568;
  undefined8 uStack_560;
  _Any_data local_558;
  code *local_548;
  code *local_540;
  _Any_data local_538;
  code *local_528;
  undefined8 uStack_520;
  _Any_data local_518;
  code *local_508;
  undefined8 uStack_500;
  _Any_data local_4f8;
  code *local_4e8;
  undefined8 uStack_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  code *local_4c0;
  _Any_data local_4b8;
  code *local_4a8;
  code *local_4a0;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  _Any_data local_478;
  code *local_468;
  code *local_460;
  _Any_data local_458;
  code *local_448;
  code *local_440;
  _Any_data local_438;
  code *local_428;
  code *local_420;
  _Any_data local_418;
  code *local_408;
  code *local_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *local_3c0;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  _Any_data local_398;
  code *local_388;
  code *local_380;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *local_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *local_2a0;
  _Any_data local_298;
  code *local_288;
  code *local_280;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_238;
  code *local_228;
  undefined8 uStack_220;
  _Any_data local_218;
  code *local_208;
  undefined8 uStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  undefined8 uStack_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  undefined8 uStack_1a0;
  _Any_data local_198;
  code *local_188;
  undefined8 uStack_180;
  _Any_data local_178;
  code *local_168;
  undefined8 uStack_160;
  _Any_data local_158;
  code *local_148;
  undefined8 uStack_140;
  _Any_data local_138;
  code *local_128;
  undefined8 uStack_120;
  _Any_data local_118;
  code *local_108;
  undefined8 uStack_100;
  _Any_data local_f8;
  code *local_e8;
  undefined8 uStack_e0;
  _Any_data local_d8;
  code *local_c8;
  undefined8 uStack_c0;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  llbuild::buildsystem::BuildKey::fromData(&local_660,in_RDX);
  KVar10 = llbuild::buildsystem::BuildKey::kindForIdentifier(*local_660.key.key._M_dataplus._M_p);
  switch(KVar10) {
  case Command:
    lVar16 = *(long *)((keyData->key)._M_string_length + 0x68);
    if (lVar16 == 0) {
LAB_0019b1be:
      __assert_fail("buildDescription",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x10b,
                    "const BuildDescription &(anonymous namespace)::BuildSystemImpl::getBuildDescription() const"
                   );
    }
    SVar24 = llbuild::buildsystem::BuildKey::getCommandName(&local_660);
    iVar11 = llvm::StringMapImpl::FindKey((StringMapImpl *)(lVar16 + 0x40),SVar24);
    uVar13 = (long)iVar11;
    if (iVar11 == -1) {
      uVar13 = (ulong)*(uint *)(lVar16 + 0x48);
    }
    lVar3 = *(long *)((keyData->key)._M_string_length + 0x68);
    if (lVar3 == 0) goto LAB_0019b1be;
    plVar14 = (long *)(uVar13 * 8 + *(long *)(lVar16 + 0x40));
    if (plVar14 == (long *)((ulong)*(uint *)(lVar3 + 0x48) * 8 + *(long *)(lVar3 + 0x40))) {
      pBVar15 = (BuildSystemRule *)operator_new(0x90);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_6f0._8_8_;
      local_6f0._0_16_ = auVar8 << 0x40;
      local_478._M_unused._M_object = (void *)0x0;
      local_478._8_8_ = 0;
      local_460 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1739:21)>
                  ::_M_invoke;
      local_468 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1739:21)>
                  ::_M_manager;
      local_498._M_unused._M_object = (void *)0x0;
      local_498._8_8_ = 0;
      local_480 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1742:22)>
                  ::_M_invoke;
      local_488 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1742:22)>
                  ::_M_manager;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_88 = (code *)0x0;
      uStack_80 = 0;
      BuildSystemRule::BuildSystemRule
                (pBVar15,in_RDX,(CommandSignature *)local_6f0,
                 (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_478,
                 (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                  *)&local_498,
                 (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
                 &local_98);
      (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      if (local_488 != (code *)0x0) {
        (*local_488)(&local_498,&local_498,__destroy_functor);
      }
      if (local_468 == (code *)0x0) goto LAB_0019af1e;
      p_Var21 = &local_478;
      pcVar18 = local_468;
    }
    else {
      plVar14 = *(long **)(*plVar14 + 8);
      pBVar15 = (BuildSystemRule *)operator_new(0x90);
      local_6f0._0_8_ = (**(code **)(*plVar14 + 0x30))(plVar14);
      local_258._8_8_ = 0;
      local_240 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1754:19)>
                  ::_M_invoke;
      local_248 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1754:19)>
                  ::_M_manager;
      local_278._8_8_ = 0;
      local_260 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1757:20)>
                  ::_M_invoke;
      local_268 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1757:20)>
                  ::_M_manager;
      local_50._8_8_ = 0;
      local_38 = std::
                 _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1762:25)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1762:25)>
                 ::_M_manager;
      local_278._M_unused._M_object = plVar14;
      local_258._M_unused._M_object = plVar14;
      local_50._M_unused._M_object = plVar14;
      BuildSystemRule::BuildSystemRule
                (pBVar15,in_RDX,(CommandSignature *)local_6f0,
                 (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_258,
                 (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                  *)&local_278,
                 (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
                 &local_50);
      (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_268 != (code *)0x0) {
        (*local_268)(&local_278,&local_278,__destroy_functor);
      }
      if (local_248 == (code *)0x0) goto LAB_0019af1e;
      p_Var21 = &local_258;
      pcVar18 = local_248;
    }
    break;
  case CustomTask:
    lVar16 = *(long *)((keyData->key)._M_string_length + 0x68);
    if (lVar16 == 0) goto LAB_0019b1be;
    plVar14 = *(long **)(lVar16 + 0x60);
    uVar2 = *(uint *)(lVar16 + 0x68);
    plVar19 = plVar14;
    if ((ulong)uVar2 != 0) {
      for (; (*plVar19 == 0 || (*plVar19 == -8)); plVar19 = plVar19 + 1) {
      }
    }
    local_668._M_head_impl = (Rule *)this;
    if (plVar19 != plVar14 + uVar2) {
      lVar16 = *plVar19;
      do {
        (**(code **)(**(long **)(lVar16 + 8) + 0x30))(local_6f0,*(long **)(lVar16 + 8),&local_660);
        if ((pointer)local_6f0._0_8_ != (pointer)0x0) {
          std::
          vector<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,std::allocator<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>>
          ::
          emplace_back<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>
                    ((vector<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,std::allocator<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>>
                      *)(keyData + 4),
                     (unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                      *)local_6f0);
          plVar14 = *(long **)(keyData[4].key._M_string_length - 8);
          pBVar15 = (BuildSystemRule *)operator_new(0x90);
          local_6b0.value = (**(code **)(*plVar14 + 0x30))(plVar14);
          local_298._8_8_ = 0;
          local_280 = std::
                      _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1787:21)>
                      ::_M_invoke;
          local_288 = std::
                      _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1787:21)>
                      ::_M_manager;
          local_2b8._8_8_ = 0;
          local_2a0 = std::
                      _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1790:22)>
                      ::_M_invoke;
          local_2a8 = std::
                      _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1790:22)>
                      ::_M_manager;
          local_70._8_8_ = 0;
          local_58 = std::
                     _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1795:27)>
                     ::_M_invoke;
          local_60 = std::
                     _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1795:27)>
                     ::_M_manager;
          local_2b8._M_unused._M_object = plVar14;
          local_298._M_unused._M_object = plVar14;
          local_70._M_unused._M_object = plVar14;
          BuildSystemRule::BuildSystemRule
                    (pBVar15,in_RDX,&local_6b0,
                     (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_298,
                     (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                      *)&local_2b8,
                     (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>
                      *)&local_70);
          this = (BuildSystemEngineDelegate *)local_668;
          ((BuildEngineDelegate *)&(local_668._M_head_impl)->_vptr_Rule)->_vptr_BuildEngineDelegate
               = (_func_int **)pBVar15;
          if (local_60 != (code *)0x0) {
            (*local_60)(&local_70,&local_70,__destroy_functor);
          }
          if (local_2a8 != (code *)0x0) {
            (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
          }
          if (local_288 != (code *)0x0) {
            (*local_288)(&local_298,&local_298,__destroy_functor);
          }
          if ((long *)local_6f0._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_6f0._0_8_ + 8))();
          }
          goto LAB_0019af1e;
        }
        do {
          do {
            plVar19 = plVar19 + 1;
            lVar16 = *plVar19;
          } while (lVar16 == 0);
        } while (lVar16 == -8);
      } while (plVar19 != plVar14 + uVar2);
    }
    pBVar15 = (BuildSystemRule *)operator_new(0x90);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_6f0._8_8_;
    local_6f0._0_16_ = auVar7 << 0x40;
    local_4b8._M_unused._M_object = (void *)0x0;
    local_4b8._8_8_ = 0;
    local_4a0 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1808:19)>
                ::_M_invoke;
    local_4a8 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1808:19)>
                ::_M_manager;
    local_4d8._M_unused._M_object = (void *)0x0;
    local_4d8._8_8_ = 0;
    local_4c0 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1811:20)>
                ::_M_invoke;
    local_4c8 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1811:20)>
                ::_M_manager;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    local_a8 = (code *)0x0;
    uStack_a0 = 0;
    BuildSystemRule::BuildSystemRule
              (pBVar15,in_RDX,(CommandSignature *)local_6f0,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_4b8,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_4d8,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_b8);
    this = (BuildSystemEngineDelegate *)local_668._M_head_impl;
    (local_668._M_head_impl)->_vptr_Rule = (_func_int **)pBVar15;
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if (local_4c8 != (code *)0x0) {
      (*local_4c8)(&local_4d8,&local_4d8,__destroy_functor);
    }
    if (local_4a8 == (code *)0x0) goto LAB_0019af1e;
    p_Var21 = &local_4b8;
    pcVar18 = local_4a8;
    break;
  case DirectoryContents:
    local_640 = in_RDX;
    SVar24 = llbuild::buildsystem::BuildKey::getDirectoryPath(&local_660);
    pcVar12 = SVar24.Data;
    if (pcVar12 == (char *)0x0) {
      pcVar22 = local_6f0 + 0x10;
      local_6f0._8_8_ = 0;
      local_6f0._0_8_ = pcVar22;
      local_6f0[0x10] = '\0';
      sVar23 = 0;
      local_668._M_head_impl = (Rule *)this;
    }
    else {
      local_6f0._0_8_ = local_6f0 + 0x10;
      local_668._M_head_impl = (Rule *)this;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6f0,pcVar12,pcVar12 + SVar24.Length);
      pcVar22 = (pointer)local_6f0._0_8_;
      sVar23 = local_6f0._8_8_;
    }
    pBVar15 = (BuildSystemRule *)operator_new(0x90);
    local_690._0_8_ = 0;
    local_6b0.value = (uint64_t)local_6a0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_6b0,pcVar22,pcVar22 + sVar23);
    local_638._8_8_ = 0;
    local_638._M_unused._M_object = operator_new(0x20);
    this = (BuildSystemEngineDelegate *)local_668._M_head_impl;
    *(code **)local_638._M_unused._0_8_ = (code *)((long)local_638._M_unused._0_8_ + 0x10);
    if ((StatNode *)local_6b0.value == (StatNode *)local_6a0) {
      *(undefined4 *)((long)local_638._M_unused._0_8_ + 0x10) = local_6a0._0_4_;
      *(undefined4 *)((long)local_638._M_unused._0_8_ + 0x14) = local_6a0._4_4_;
      *(undefined4 *)((long)local_638._M_unused._0_8_ + 0x18) = local_6a0._8_4_;
      *(undefined4 *)((long)local_638._M_unused._0_8_ + 0x1c) = local_6a0._12_4_;
    }
    else {
      *(uint64_t *)local_638._M_unused._0_8_ = local_6b0.value;
      *(long *)((long)local_638._M_unused._0_8_ + 0x10) = CONCAT44(local_6a0._4_4_,local_6a0._0_4_);
    }
    *(long *)((long)local_638._M_unused._0_8_ + 8) = local_6a8;
    local_6a8 = 0;
    local_6a0._0_4_ = local_6a0._0_4_ & 0xffffff00;
    local_620 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1823:19)>
                ::_M_invoke;
    local_628 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1823:19)>
                ::_M_manager;
    local_6b0.value = (uint64_t)local_6a0;
    local_690._8_8_ = &local_678;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_690 + 8),local_6f0._0_8_,
               (pointer)(local_6f0._0_8_ + local_6f0._8_8_));
    local_5b8._8_8_ = 0;
    local_5b8._M_unused._M_object = operator_new(0x20);
    *(code **)local_5b8._M_unused._0_8_ = (code *)((long)local_5b8._M_unused._0_8_ + 0x10);
    if ((undefined1 *)local_690._8_8_ == &local_678) {
      *(long *)((long)local_5b8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_677,local_678);
      *(long *)((long)local_5b8._M_unused._0_8_ + 0x18) = lStack_670;
    }
    else {
      *(undefined8 *)local_5b8._M_unused._0_8_ = local_690._8_8_;
      *(long *)((long)local_5b8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_677,local_678);
    }
    *(long *)((long)local_5b8._M_unused._0_8_ + 8) = local_680;
    local_680 = 0;
    local_678 = 0;
    local_5a0 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1826:20)>
                ::_M_invoke;
    local_5a8 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1826:20)>
                ::_M_manager;
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_c8 = (code *)0x0;
    uStack_c0 = 0;
    local_690._8_8_ = &local_678;
    BuildSystemRule::BuildSystemRule
              (pBVar15,local_640,(CommandSignature *)local_690,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_638,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_5b8,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_d8);
    ((Rule *)this)->_vptr_Rule = (_func_int **)pBVar15;
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
    if (local_5a8 != (code *)0x0) {
      (*local_5a8)(&local_5b8,&local_5b8,__destroy_functor);
    }
    if ((undefined1 *)local_690._8_8_ != &local_678) {
      operator_delete((void *)local_690._8_8_,CONCAT71(uStack_677,local_678) + 1);
    }
    if (local_628 != (code *)0x0) {
      (*local_628)(&local_638,&local_638,__destroy_functor);
    }
    if ((StatNode *)local_6b0.value != (StatNode *)local_6a0) {
      operator_delete((void *)local_6b0.value,CONCAT44(local_6a0._4_4_,local_6a0._0_4_) + 1);
    }
    if ((StatNode *)local_6f0._0_8_ == (StatNode *)(local_6f0 + 0x10)) goto LAB_0019af1e;
    lVar16 = CONCAT71(local_6f0._17_7_,local_6f0[0x10]);
    CVar20.value = local_6f0._0_8_;
    goto LAB_0019a9ca;
  case FilteredDirectoryContents:
    SVar24 = llbuild::buildsystem::BuildKey::getFilteredDirectoryPath(&local_660);
    pcVar12 = SVar24.Data;
    if (pcVar12 == (char *)0x0) {
      local_6b0.value = (uint64_t)local_6a0;
      local_6a8 = 0;
      local_6a0._0_4_ = local_6a0._0_4_ & 0xffffff00;
    }
    else {
      local_6b0.value = (uint64_t)local_6a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6b0,pcVar12,pcVar12 + SVar24.Length);
    }
    SVar24 = llbuild::buildsystem::BuildKey::getContentExclusionPatterns(&local_660);
    pcVar12 = SVar24.Data;
    if (pcVar12 == (char *)0x0) {
      local_690._8_8_ = &local_678;
      local_680 = 0;
      local_678 = 0;
    }
    else {
      local_690._8_8_ = &local_678;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_690 + 8),pcVar12,pcVar12 + SVar24.Length);
    }
    pBVar15 = (BuildSystemRule *)operator_new(0x90);
    local_690._0_8_ = 0;
    pcVar22 = local_6f0 + 0x10;
    local_6f0._0_8_ = pcVar22;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6f0,local_6b0.value,(undefined1 *)(local_6a8 + local_6b0.value));
    local_6d0._M_allocated_capacity = (size_type)&local_6c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6d0,local_690._8_8_,(undefined1 *)(local_680 + local_690._8_8_));
    local_5c8 = (code *)0x0;
    pcStack_5c0 = (code *)0x0;
    local_5d8._M_unused._M_object = (void *)0x0;
    local_5d8._8_8_ = 0;
    local_5d8._M_unused._M_object = operator_new(0x40);
    *(code **)local_5d8._M_unused._0_8_ = (code *)((long)local_5d8._M_unused._0_8_ + 0x10);
    if ((pointer)local_6f0._0_8_ == pcVar22) {
      *(ulong *)((long)local_5d8._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6f0._17_7_,local_6f0[0x10]);
      *(undefined8 *)((long)local_5d8._M_unused._0_8_ + 0x18) = local_6f0._24_8_;
    }
    else {
      *(undefined8 *)local_5d8._M_unused._0_8_ = local_6f0._0_8_;
      *(ulong *)((long)local_5d8._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6f0._17_7_,local_6f0[0x10]);
    }
    *(undefined8 *)((long)local_5d8._M_unused._0_8_ + 8) = local_6f0._8_8_;
    local_6f0._8_8_ = 0;
    local_6f0._0_8_ = pcVar22;
    local_6f0[0x10] = '\0';
    *(code **)((long)local_5d8._M_unused._0_8_ + 0x20) =
         (code *)((long)local_5d8._M_unused._0_8_ + 0x30);
    if ((undefined1 *)local_6d0._M_allocated_capacity == &local_6c0) {
      *(ulong *)((long)local_5d8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6bf,local_6c0);
      *(ulong *)((long)local_5d8._M_unused._0_8_ + 0x38) = uStack_6b8;
    }
    else {
      *(size_type *)((long)local_5d8._M_unused._0_8_ + 0x20) = local_6d0._M_allocated_capacity;
      *(ulong *)((long)local_5d8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6bf,local_6c0);
    }
    *(undefined8 *)((long)local_5d8._M_unused._0_8_ + 0x28) = local_6d0._8_8_;
    local_6d0._8_8_ = 0;
    local_6c0 = 0;
    pcStack_5c0 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1840:19)>
                  ::_M_invoke;
    local_5c8 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1840:19)>
                ::_M_manager;
    local_4f8._M_unused._M_object = (void *)0x0;
    local_4f8._8_8_ = 0;
    local_4e8 = (code *)0x0;
    uStack_4e0 = 0;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_e8 = (code *)0x0;
    uStack_e0 = 0;
    local_6d0._M_allocated_capacity = (size_type)&local_6c0;
    BuildSystemRule::BuildSystemRule
              (pBVar15,in_RDX,(CommandSignature *)local_690,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_5d8,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_4f8,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_f8);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    if (local_4e8 != (code *)0x0) {
      (*local_4e8)(&local_4f8,&local_4f8,__destroy_functor);
    }
    if (local_5c8 != (code *)0x0) {
      p_Var21 = &local_5d8;
      pcVar18 = local_5c8;
LAB_0019a95a:
      (*pcVar18)(p_Var21,p_Var21,__destroy_functor);
    }
    goto LAB_0019a964;
  case DirectoryTreeSignature:
    SVar24 = llbuild::buildsystem::BuildKey::getDirectoryTreeSignaturePath(&local_660);
    pcVar12 = SVar24.Data;
    if (pcVar12 == (char *)0x0) {
      local_6b0.value = (uint64_t)local_6a0;
      local_6a8 = 0;
      local_6a0._0_4_ = local_6a0._0_4_ & 0xffffff00;
    }
    else {
      local_6b0.value = (uint64_t)local_6a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6b0,pcVar12,pcVar12 + SVar24.Length);
    }
    SVar24 = llbuild::buildsystem::BuildKey::getContentExclusionPatterns(&local_660);
    pcVar12 = SVar24.Data;
    if (pcVar12 == (char *)0x0) {
      local_690._8_8_ = &local_678;
      local_680 = 0;
      local_678 = 0;
    }
    else {
      local_690._8_8_ = &local_678;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_690 + 8),pcVar12,pcVar12 + SVar24.Length);
    }
    pBVar15 = (BuildSystemRule *)operator_new(0x90);
    local_690._0_8_ = 0;
    pcVar22 = local_6f0 + 0x10;
    local_6f0._0_8_ = pcVar22;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6f0,local_6b0.value,(undefined1 *)(local_6a8 + local_6b0.value));
    local_6d0._M_allocated_capacity = (size_type)&local_6c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6d0,local_690._8_8_,(undefined1 *)(local_680 + local_690._8_8_));
    local_5e8 = (code *)0x0;
    pcStack_5e0 = (code *)0x0;
    local_5f8._M_unused._M_object = (void *)0x0;
    local_5f8._8_8_ = 0;
    local_5f8._M_unused._M_object = operator_new(0x40);
    *(code **)local_5f8._M_unused._0_8_ = (code *)((long)local_5f8._M_unused._0_8_ + 0x10);
    if ((pointer)local_6f0._0_8_ == pcVar22) {
      *(ulong *)((long)local_5f8._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6f0._17_7_,local_6f0[0x10]);
      *(undefined8 *)((long)local_5f8._M_unused._0_8_ + 0x18) = local_6f0._24_8_;
    }
    else {
      *(undefined8 *)local_5f8._M_unused._0_8_ = local_6f0._0_8_;
      *(ulong *)((long)local_5f8._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6f0._17_7_,local_6f0[0x10]);
    }
    *(undefined8 *)((long)local_5f8._M_unused._0_8_ + 8) = local_6f0._8_8_;
    local_6f0._8_8_ = 0;
    local_6f0._0_8_ = pcVar22;
    local_6f0[0x10] = '\0';
    *(code **)((long)local_5f8._M_unused._0_8_ + 0x20) =
         (code *)((long)local_5f8._M_unused._0_8_ + 0x30);
    if ((undefined1 *)local_6d0._M_allocated_capacity == &local_6c0) {
      *(ulong *)((long)local_5f8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6bf,local_6c0);
      *(ulong *)((long)local_5f8._M_unused._0_8_ + 0x38) = uStack_6b8;
    }
    else {
      *(size_type *)((long)local_5f8._M_unused._0_8_ + 0x20) = local_6d0._M_allocated_capacity;
      *(ulong *)((long)local_5f8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6bf,local_6c0);
    }
    *(undefined8 *)((long)local_5f8._M_unused._0_8_ + 0x28) = local_6d0._8_8_;
    local_6d0._8_8_ = 0;
    local_6c0 = 0;
    pcStack_5e0 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1854:19)>
                  ::_M_invoke;
    local_5e8 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1854:19)>
                ::_M_manager;
    local_518._M_unused._M_object = (void *)0x0;
    local_518._8_8_ = 0;
    local_508 = (code *)0x0;
    uStack_500 = 0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_108 = (code *)0x0;
    uStack_100 = 0;
    local_6d0._M_allocated_capacity = (size_type)&local_6c0;
    BuildSystemRule::BuildSystemRule
              (pBVar15,in_RDX,(CommandSignature *)local_690,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_5f8,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_518,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_118);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
    if (local_508 != (code *)0x0) {
      (*local_508)(&local_518,&local_518,__destroy_functor);
    }
    if (local_5e8 != (code *)0x0) {
      p_Var21 = &local_5f8;
      pcVar18 = local_5e8;
      goto LAB_0019a95a;
    }
    goto LAB_0019a964;
  case DirectoryTreeStructureSignature:
    SVar24 = llbuild::buildsystem::BuildKey::getFilteredDirectoryPath(&local_660);
    pcVar12 = SVar24.Data;
    if (pcVar12 == (char *)0x0) {
      local_6b0.value = (uint64_t)local_6a0;
      local_6a8 = 0;
      local_6a0._0_4_ = local_6a0._0_4_ & 0xffffff00;
    }
    else {
      local_6b0.value = (uint64_t)local_6a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6b0,pcVar12,pcVar12 + SVar24.Length);
    }
    SVar24 = llbuild::buildsystem::BuildKey::getContentExclusionPatterns(&local_660);
    pcVar12 = SVar24.Data;
    if (pcVar12 == (char *)0x0) {
      local_690._8_8_ = &local_678;
      local_680 = 0;
      local_678 = 0;
    }
    else {
      local_690._8_8_ = &local_678;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_690 + 8),pcVar12,pcVar12 + SVar24.Length);
    }
    pBVar15 = (BuildSystemRule *)operator_new(0x90);
    local_690._0_8_ = 0;
    pcVar22 = local_6f0 + 0x10;
    local_6f0._0_8_ = pcVar22;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6f0,local_6b0.value,(undefined1 *)(local_6a8 + local_6b0.value));
    local_6d0._M_allocated_capacity = (size_type)&local_6c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6d0,local_690._8_8_,(undefined1 *)(local_680 + local_690._8_8_));
    local_608 = (code *)0x0;
    pcStack_600 = (code *)0x0;
    local_618._M_unused._M_object = (void *)0x0;
    local_618._8_8_ = 0;
    local_618._M_unused._M_object = operator_new(0x40);
    *(code **)local_618._M_unused._0_8_ = (code *)((long)local_618._M_unused._0_8_ + 0x10);
    if ((pointer)local_6f0._0_8_ == pcVar22) {
      *(ulong *)((long)local_618._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6f0._17_7_,local_6f0[0x10]);
      *(undefined8 *)((long)local_618._M_unused._0_8_ + 0x18) = local_6f0._24_8_;
    }
    else {
      *(undefined8 *)local_618._M_unused._0_8_ = local_6f0._0_8_;
      *(ulong *)((long)local_618._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6f0._17_7_,local_6f0[0x10]);
    }
    *(undefined8 *)((long)local_618._M_unused._0_8_ + 8) = local_6f0._8_8_;
    local_6f0._8_8_ = 0;
    local_6f0._0_8_ = pcVar22;
    local_6f0[0x10] = '\0';
    *(code **)((long)local_618._M_unused._0_8_ + 0x20) =
         (code *)((long)local_618._M_unused._0_8_ + 0x30);
    if ((undefined1 *)local_6d0._M_allocated_capacity == &local_6c0) {
      *(ulong *)((long)local_618._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6bf,local_6c0);
      *(ulong *)((long)local_618._M_unused._0_8_ + 0x38) = uStack_6b8;
    }
    else {
      *(size_type *)((long)local_618._M_unused._0_8_ + 0x20) = local_6d0._M_allocated_capacity;
      *(ulong *)((long)local_618._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6bf,local_6c0);
    }
    *(undefined8 *)((long)local_618._M_unused._0_8_ + 0x28) = local_6d0._8_8_;
    local_6d0._8_8_ = 0;
    local_6c0 = 0;
    pcStack_600 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1871:19)>
                  ::_M_invoke;
    local_608 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1871:19)>
                ::_M_manager;
    local_538._M_unused._M_object = (void *)0x0;
    local_538._8_8_ = 0;
    local_528 = (code *)0x0;
    uStack_520 = 0;
    local_138._M_unused._M_object = (void *)0x0;
    local_138._8_8_ = 0;
    local_128 = (code *)0x0;
    uStack_120 = 0;
    local_6d0._M_allocated_capacity = (size_type)&local_6c0;
    BuildSystemRule::BuildSystemRule
              (pBVar15,in_RDX,(CommandSignature *)local_690,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_618,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_538,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_138);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    if (local_528 != (code *)0x0) {
      (*local_528)(&local_538,&local_538,__destroy_functor);
    }
    if (local_608 != (code *)0x0) {
      p_Var21 = &local_618;
      pcVar18 = local_608;
      goto LAB_0019a95a;
    }
LAB_0019a964:
    if ((undefined1 *)local_6d0._M_allocated_capacity != &local_6c0) {
      operator_delete((void *)local_6d0._M_allocated_capacity,CONCAT71(uStack_6bf,local_6c0) + 1);
    }
    if ((undefined1 *)local_6f0._0_8_ != local_6f0 + 0x10) {
      operator_delete((void *)local_6f0._0_8_,CONCAT71(local_6f0._17_7_,local_6f0[0x10]) + 1);
    }
    if ((undefined1 *)local_690._8_8_ != &local_678) {
      operator_delete((void *)local_690._8_8_,CONCAT71(uStack_677,local_678) + 1);
    }
    if ((StatNode *)local_6b0.value != (StatNode *)local_6a0) {
      lVar16 = CONCAT44(local_6a0._4_4_,local_6a0._0_4_);
      CVar20.value = local_6b0.value;
LAB_0019a9ca:
      operator_delete((void *)CVar20.value,lVar16 + 1);
    }
    goto LAB_0019af1e;
  case Node:
    SVar24 = llbuild::buildsystem::BuildKey::getNodeName(&local_660);
    this_00 = lookupNode((BuildSystemEngineDelegate *)keyData,SVar24);
    NVar1 = this_00->type;
    if ((this_00->super_Node).producers.
        super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_00->super_Node).producers.
        super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar15 = (BuildSystemRule *)operator_new(0x90);
      if (NVar1 == Directory) {
        local_6f0._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_2f8._8_8_ = 0;
        local_2e0 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1915:23)>
                    ::_M_invoke;
        local_2e8 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1915:23)>
                    ::_M_manager;
        local_578._M_unused._M_object = (void *)0x0;
        local_578._8_8_ = 0;
        local_568 = (code *)0x0;
        uStack_560 = 0;
        local_178._M_unused._M_object = (void *)0x0;
        local_178._8_8_ = 0;
        local_168 = (code *)0x0;
        uStack_160 = 0;
        local_2f8._M_unused._0_8_ = (undefined8)this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar15,in_RDX,(CommandSignature *)local_6f0,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_2f8,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_578,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_178);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
        if (local_168 != (code *)0x0) {
          (*local_168)(&local_178,&local_178,__destroy_functor);
        }
        if (local_568 != (code *)0x0) {
          (*local_568)(&local_578,&local_578,__destroy_functor);
        }
        if (local_2e8 == (code *)0x0) goto LAB_0019af1e;
        p_Var21 = &local_2f8;
        pcVar18 = local_2e8;
      }
      else if (NVar1 == DirectoryStructure) {
        local_6f0._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_318._8_8_ = 0;
        local_300 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1928:23)>
                    ::_M_invoke;
        local_308 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1928:23)>
                    ::_M_manager;
        local_598._M_unused._M_object = (void *)0x0;
        local_598._8_8_ = 0;
        local_588 = (code *)0x0;
        uStack_580 = 0;
        local_198._M_unused._M_object = (void *)0x0;
        local_198._8_8_ = 0;
        local_188 = (code *)0x0;
        uStack_180 = 0;
        local_318._M_unused._0_8_ = (undefined8)this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar15,in_RDX,(CommandSignature *)local_6f0,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_318,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_598,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_198);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
        if (local_188 != (code *)0x0) {
          (*local_188)(&local_198,&local_198,__destroy_functor);
        }
        if (local_588 != (code *)0x0) {
          (*local_588)(&local_598,&local_598,__destroy_functor);
        }
        if (local_308 == (code *)0x0) goto LAB_0019af1e;
        p_Var21 = &local_318;
        pcVar18 = local_308;
      }
      else if (NVar1 == Virtual) {
        local_6f0._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_558._M_unused._M_object = (void *)0x0;
        local_558._8_8_ = 0;
        local_540 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1899:23)>
                    ::_M_invoke;
        local_548 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1899:23)>
                    ::_M_manager;
        local_2d8._8_8_ = 0;
        local_2c0 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1902:24)>
                    ::_M_invoke;
        local_2c8 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1902:24)>
                    ::_M_manager;
        local_158._M_unused._M_object = (void *)0x0;
        local_158._8_8_ = 0;
        local_148 = (code *)0x0;
        uStack_140 = 0;
        local_2d8._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar15,in_RDX,(CommandSignature *)local_6f0,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_558,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_2d8,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_158);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
        if (local_148 != (code *)0x0) {
          (*local_148)(&local_158,&local_158,__destroy_functor);
        }
        if (local_2c8 != (code *)0x0) {
          (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
        }
        if (local_548 == (code *)0x0) goto LAB_0019af1e;
        p_Var21 = &local_558;
        pcVar18 = local_548;
      }
      else {
        local_6f0._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_338._8_8_ = 0;
        local_320 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1941:21)>
                    ::_M_invoke;
        local_328 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1941:21)>
                    ::_M_manager;
        local_358._8_8_ = 0;
        local_340 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1944:22)>
                    ::_M_invoke;
        local_348 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1944:22)>
                    ::_M_manager;
        local_1b8._M_unused._M_object = (void *)0x0;
        local_1b8._8_8_ = 0;
        local_1a8 = (code *)0x0;
        uStack_1a0 = 0;
        local_358._M_unused._0_8_ = (undefined8)this_00;
        local_338._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar15,in_RDX,(CommandSignature *)local_6f0,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_338,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_358,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_1b8);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
        if (local_1a8 != (code *)0x0) {
          (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
        }
        if (local_348 != (code *)0x0) {
          (*local_348)(&local_358,&local_358,__destroy_functor);
        }
        if (local_328 == (code *)0x0) goto LAB_0019af1e;
        p_Var21 = &local_338;
        pcVar18 = local_328;
      }
    }
    else {
      pBVar15 = (BuildSystemRule *)operator_new(0x90);
      if (NVar1 == Directory) {
        local_6f0._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_378._8_8_ = 0;
        local_360 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1958:21)>
                    ::_M_invoke;
        local_368 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1958:21)>
                    ::_M_manager;
        local_398._8_8_ = 0;
        local_380 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1961:22)>
                    ::_M_invoke;
        local_388 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1961:22)>
                    ::_M_manager;
        local_1d8._M_unused._M_object = (void *)0x0;
        local_1d8._8_8_ = 0;
        local_1c8 = (code *)0x0;
        uStack_1c0 = 0;
        local_398._M_unused._0_8_ = this_00;
        local_378._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar15,in_RDX,(CommandSignature *)local_6f0,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_378,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_398,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_1d8);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
        if (local_1c8 != (code *)0x0) {
          (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
        }
        if (local_388 != (code *)0x0) {
          (*local_388)(&local_398,&local_398,__destroy_functor);
        }
        if (local_368 == (code *)0x0) goto LAB_0019af1e;
        p_Var21 = &local_378;
        pcVar18 = local_368;
      }
      else {
        local_6f0._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_3b8._8_8_ = 0;
        local_3a0 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1973:19)>
                    ::_M_invoke;
        local_3a8 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1973:19)>
                    ::_M_manager;
        local_3d8._8_8_ = 0;
        local_3c0 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1976:20)>
                    ::_M_invoke;
        local_3c8 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1976:20)>
                    ::_M_manager;
        local_1f8._M_unused._M_object = (void *)0x0;
        local_1f8._8_8_ = 0;
        local_1e8 = (code *)0x0;
        uStack_1e0 = 0;
        local_3d8._M_unused._0_8_ = this_00;
        local_3b8._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar15,in_RDX,(CommandSignature *)local_6f0,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_3b8,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_3d8,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_1f8);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
        if (local_1e8 != (code *)0x0) {
          (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
        }
        if (local_3c8 != (code *)0x0) {
          (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
        }
        if (local_3a8 == (code *)0x0) goto LAB_0019af1e;
        p_Var21 = &local_3b8;
        pcVar18 = local_3a8;
      }
    }
    break;
  case Stat:
    this_02 = &keyData[2].key._M_string_length;
    SVar24 = llbuild::buildsystem::BuildKey::getStatName(&local_660);
    pcVar12 = SVar24.Data;
    if (pcVar12 == (char *)0x0) {
      local_6f0._8_8_ = 0;
      local_6f0._0_8_ = local_6f0 + 0x10;
      local_6f0[0x10] = '\0';
    }
    else {
      local_6f0._0_8_ = local_6f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6f0,pcVar12,pcVar12 + SVar24.Length);
    }
    iVar17 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)this_02,(key_type *)local_6f0);
    if ((undefined1 *)local_6f0._0_8_ != local_6f0 + 0x10) {
      operator_delete((void *)local_6f0._0_8_,CONCAT71(local_6f0._17_7_,local_6f0[0x10]) + 1);
    }
    if (iVar17.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_6f0._0_16_ = (undefined1  [16])llbuild::buildsystem::BuildKey::getStatName(&local_660);
      llvm::make_unique<llbuild::buildsystem::StatNode,llvm::StringRef>
                ((llvm *)&local_6b0,(StringRef *)local_6f0);
      CVar20.value = local_6b0.value;
      SVar24 = llbuild::buildsystem::BuildKey::getStatName(&local_660);
      pcVar12 = SVar24.Data;
      if (pcVar12 == (char *)0x0) {
        local_6f0._8_8_ = 0;
        local_6f0._0_8_ = local_6f0 + 0x10;
        local_6f0[0x10] = '\0';
      }
      else {
        local_6f0._0_8_ = local_6f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f0,pcVar12,pcVar12 + SVar24.Length);
      }
      this_01 = (default_delete<llbuild::buildsystem::StatNode> *)
                std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_02,(key_type *)local_6f0);
      CVar9.value = local_6b0.value;
      local_6b0.value = 0;
      __ptr = *(StatNode **)this_01;
      *(uint64_t *)this_01 = CVar9.value;
      if (__ptr != (StatNode *)0x0) {
        std::default_delete<llbuild::buildsystem::StatNode>::operator()(this_01,__ptr);
      }
      if ((undefined1 *)local_6f0._0_8_ != local_6f0 + 0x10) {
        operator_delete((void *)local_6f0._0_8_,CONCAT71(local_6f0._17_7_,local_6f0[0x10]) + 1);
      }
      if ((StatNode *)local_6b0.value != (StatNode *)0x0) {
        std::default_delete<llbuild::buildsystem::StatNode>::operator()
                  ((default_delete<llbuild::buildsystem::StatNode> *)&local_6b0,
                   (StatNode *)local_6b0.value);
      }
    }
    else {
      CVar20.value = *(undefined8 *)
                      ((long)iVar17.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
                             ._M_cur + 0x28);
    }
    pBVar15 = (BuildSystemRule *)operator_new(0x90);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_6f0._8_8_;
    local_6f0._0_16_ = auVar5 << 0x40;
    local_3f8._8_8_ = 0;
    local_3e0 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2000:19)>
                ::_M_invoke;
    local_3e8 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2000:19)>
                ::_M_manager;
    local_418._8_8_ = 0;
    local_400 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2003:20)>
                ::_M_invoke;
    local_408 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2003:20)>
                ::_M_manager;
    local_218._M_unused._M_object = (void *)0x0;
    local_218._8_8_ = 0;
    local_208 = (code *)0x0;
    uStack_200 = 0;
    local_418._M_unused._0_8_ = (undefined8)CVar20.value;
    local_3f8._M_unused._0_8_ = CVar20.value;
    BuildSystemRule::BuildSystemRule
              (pBVar15,in_RDX,(CommandSignature *)local_6f0,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_3f8,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_418,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_218);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
    if (local_208 != (code *)0x0) {
      (*local_208)(&local_218,&local_218,__destroy_functor);
    }
    if (local_408 != (code *)0x0) {
      (*local_408)(&local_418,&local_418,__destroy_functor);
    }
    if (local_3e8 == (code *)0x0) goto LAB_0019af1e;
    p_Var21 = &local_3f8;
    pcVar18 = local_3e8;
    break;
  case Target:
    lVar16 = *(long *)((keyData->key)._M_string_length + 0x68);
    if (lVar16 == 0) goto LAB_0019b1be;
    SVar24 = llbuild::buildsystem::BuildKey::getTargetName(&local_660);
    iVar11 = llvm::StringMapImpl::FindKey((StringMapImpl *)(lVar16 + 0x20),SVar24);
    uVar13 = (long)iVar11;
    if (iVar11 == -1) {
      uVar13 = (ulong)*(uint *)(lVar16 + 0x28);
    }
    lVar3 = *(long *)((keyData->key)._M_string_length + 0x68);
    if (lVar3 == 0) goto LAB_0019b1be;
    plVar14 = (long *)(uVar13 * 8 + *(long *)(lVar16 + 0x20));
    if (plVar14 == (long *)((ulong)*(uint *)(lVar3 + 0x28) * 8 + *(long *)(lVar3 + 0x20))) {
      __assert_fail("0 && \"FIXME: invalid target\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x7df,
                    "virtual std::unique_ptr<Rule> (anonymous namespace)::BuildSystemEngineDelegate::lookupRule(const KeyType &)"
                   );
    }
    pvVar4 = *(void **)(*plVar14 + 8);
    pBVar15 = (BuildSystemRule *)operator_new(0x90);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_6f0._8_8_;
    local_6f0._0_16_ = auVar6 << 0x40;
    local_438._8_8_ = 0;
    local_420 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2024:19)>
                ::_M_invoke;
    local_428 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2024:19)>
                ::_M_manager;
    local_458._8_8_ = 0;
    local_440 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2027:20)>
                ::_M_invoke;
    local_448 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2027:20)>
                ::_M_manager;
    local_238._M_unused._M_object = (void *)0x0;
    local_238._8_8_ = 0;
    local_228 = (code *)0x0;
    uStack_220 = 0;
    local_458._M_unused._M_object = pvVar4;
    local_438._M_unused._M_object = pvVar4;
    BuildSystemRule::BuildSystemRule
              (pBVar15,in_RDX,(CommandSignature *)local_6f0,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_438,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_458,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_238);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar15;
    if (local_228 != (code *)0x0) {
      (*local_228)(&local_238,&local_238,__destroy_functor);
    }
    if (local_448 != (code *)0x0) {
      (*local_448)(&local_458,&local_458,__destroy_functor);
    }
    if (local_428 == (code *)0x0) goto LAB_0019af1e;
    p_Var21 = &local_438;
    pcVar18 = local_428;
    break;
  default:
    __assert_fail("0 && \"invalid key type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                  ,0x7f4,
                  "virtual std::unique_ptr<Rule> (anonymous namespace)::BuildSystemEngineDelegate::lookupRule(const KeyType &)"
                 );
  }
  (*pcVar18)(p_Var21,p_Var21,__destroy_functor);
LAB_0019af1e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.key.key._M_dataplus._M_p != &local_660.key.key.field_2) {
    operator_delete(local_660.key.key._M_dataplus._M_p,
                    local_660.key.key.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
         )(tuple<llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)this;
}

Assistant:

std::unique_ptr<Rule> BuildSystemEngineDelegate::lookupRule(const KeyType& keyData) {
  // Decode the key.
  auto key = BuildKey::fromData(keyData);

  switch (key.getKind()) {
  case BuildKey::Kind::Unknown:
    break;
    
  case BuildKey::Kind::Command: {
    // Find the comand.
    auto it = getBuildDescription().getCommands().find(key.getCommandName());
    if (it == getBuildDescription().getCommands().end()) {
      // If there is no such command, produce an error task.
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        /*signature=*/{},
        /*Action=*/ [](BuildEngine& engine) -> Task* {
          return new MissingCommandTask();
        },
        /*IsValid=*/ [](BuildEngine&, const Rule&, const ValueType&) -> bool {
          // The cached result for a missing command is never valid.
          return false;
        }
      ));
    }

    // Create the rule for the command.
    Command* command = it->second.get();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      command->getSignature(),
      /*Action=*/ [command](BuildEngine& engine) -> Task* {
        return new CommandTask(*command);
      },
      /*IsValid=*/ [command](BuildEngine& engine, const Rule& rule,
                             const ValueType& value) -> bool {
        return CommandTask::isResultValid(
            engine, *command, BuildValue::fromData(value));
      },
      /*UpdateStatus=*/ [command](BuildEngine& engine,
                                  core::Rule::StatusKind status) {
        return ::getBuildSystem(engine).getDelegate().commandStatusChanged(
            command, convertStatusKind(status));
      }
    ));
  }

  case BuildKey::Kind::CustomTask: {
    // Search for a tool which knows how to create the given custom task.
    //
    // FIXME: We should most likely have some kind of registration process so we
    // can do an efficient query here, but exactly how this should look isn't
    // clear yet.
    for (const auto& it: getBuildDescription().getTools()) {
      auto result = it.second->createCustomCommand(key);
      if (!result) continue;

      // Save the custom command.
      customTasks.emplace_back(std::move(result));
      Command *command = customTasks.back().get();
      
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        command->getSignature(),
        /*Action=*/ [command](BuildEngine& engine) -> Task* {
          return new CommandTask(*command);
        },
        /*IsValid=*/ [command](BuildEngine& engine, const Rule& rule,
                               const ValueType& value) -> bool {
          return CommandTask::isResultValid(
              engine, *command, BuildValue::fromData(value));
        },
        /*UpdateStatus=*/ [command](BuildEngine& engine,
                                    core::Rule::StatusKind status) {
          return ::getBuildSystem(engine).getDelegate().commandStatusChanged(
              command, convertStatusKind(status));
        }
      ));
    }
    
    // We were unable to create an appropriate custom command, produce an error
    // task.
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [](BuildEngine& engine) -> Task* {
        return new MissingCommandTask();
      },
      /*IsValid=*/ [](BuildEngine&, const Rule&, const ValueType&) -> bool {
        // The cached result for a missing command is never valid.
        return false;
      }
    ));
  }

  case BuildKey::Kind::DirectoryContents: {
    std::string path = key.getDirectoryPath();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path](BuildEngine& engine) -> Task* {
        return new DirectoryContentsTask(path);
      },
      /*IsValid=*/ [path](BuildEngine& engine, const Rule& rule,
          const ValueType& value) mutable -> bool {
        return DirectoryContentsTask::isResultValid(
            engine, path, BuildValue::fromData(value));
      }
    ));
  }

  case BuildKey::Kind::FilteredDirectoryContents: {
    std::string path = key.getFilteredDirectoryPath();
    std::string patterns = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, patterns](BuildEngine& engine) -> Task* {
        BinaryDecoder decoder(patterns);
        return new FilteredDirectoryContentsTask(path, StringList(decoder));
      },
      /*IsValid=*/ nullptr
    ));
  }

  case BuildKey::Kind::DirectoryTreeSignature: {
    std::string path = key.getDirectoryTreeSignaturePath();
    std::string filters = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, filters](
          BuildEngine& engine) mutable -> Task* {
        BinaryDecoder decoder(filters);
        return new DirectoryTreeSignatureTask(path, StringList(decoder));
      },
        // Directory signatures don't require any validation outside of their
        // concrete dependencies.
      /*IsValid=*/ nullptr
    ));
  }

  case BuildKey::Kind::DirectoryTreeStructureSignature: {
    std::string path = key.getFilteredDirectoryPath();
    std::string filters = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, filters](
          BuildEngine& engine) mutable -> Task* {
        BinaryDecoder decoder(filters);
        return new DirectoryTreeStructureSignatureTask(path, StringList(decoder));
      },
        // Directory signatures don't require any validation outside of their
        // concrete dependencies.
      /*IsValid=*/ nullptr
    ));
  }
    
  case BuildKey::Kind::Node: {
    // Find the node.
    BuildNode* node = lookupNode(key.getNodeName());

    // Create the rule used to construct this node.
    //
    // We could bypass this level and directly return the rule to run the
    // command, which would reduce the number of tasks in the system. For now we
    // do the uniform thing, but do differentiate between input and command
    // nodes.

    // Create an input node if there are no producers.
    if (node->getProducers().empty()) {
      if (node->isVirtual()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [](BuildEngine& engine) -> Task* {
            return new VirtualInputNodeTask();
          },
          /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                                const ValueType& value) -> bool {
            return VirtualInputNodeTask::isResultValid(
                engine, *node, BuildValue::fromData(value));
          }
        ));
      }

      // DirectoryInputNodeTask
      if (node->isDirectory()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [node](BuildEngine& engine) -> Task* {
            return new DirectoryInputNodeTask(*node);
          },
            // Directory nodes don't require any validation outside of their
            // concrete dependencies.
          /*IsValid=*/ nullptr
        ));
      }

      if (node->isDirectoryStructure()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [node](BuildEngine& engine) -> Task* {
            return new DirectoryStructureInputNodeTask(*node);
          },
            // Directory nodes don't require any validation outside of their
            // concrete dependencies.
          /*IsValid=*/ nullptr
        ));
      }

      // FileInputNodeTask
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        node->getSignature(),
        /*Action=*/ [node](BuildEngine& engine) -> Task* {
          return new FileInputNodeTask(*node);
        },
        /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
          return FileInputNodeTask::isResultValid(
              engine, *node, BuildValue::fromData(value));
        }
      ));
    }

    // Otherwise, create a task for a produced node.
    // ProducedDirectoryNodeTask
    if (node->isDirectory()) {
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        node->getSignature(),
        /*Action=*/ [node](BuildEngine& engine) -> Task* {
          return new ProducedDirectoryNodeTask(*node);
        },
        /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
          return ProducedDirectoryNodeTask::isResultValid(
              engine, *node, BuildValue::fromData(value));
        }
      ));
    }

    // ProducedNodeTask
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      node->getSignature(),
      /*Action=*/ [node](BuildEngine& engine) -> Task* {
        return new ProducedNodeTask(*node);
      },
      /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                          const ValueType& value) -> bool {
        return ProducedNodeTask::isResultValid(
            engine, *node, BuildValue::fromData(value));
      }
    ));
  }

  case BuildKey::Kind::Stat: {
    StatNode* statnode;
    auto it = dynamicStatNodes.find(key.getStatName());
    if (it != dynamicStatNodes.end()) {
      statnode = it->second.get();
    } else {
      // Create nodes on the fly for any unknown ones.
      auto statOwner = llvm::make_unique<StatNode>(key.getStatName());
      statnode = statOwner.get();
      dynamicStatNodes[key.getStatName()] = std::move(statOwner);
    }

    // Create the rule to construct this target.
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [statnode](BuildEngine& engine) -> Task* {
        return new StatTask(*statnode);
      },
      /*IsValid=*/ [statnode](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
        return StatTask::isResultValid(
            engine, *statnode, BuildValue::fromData(value));
      }
    ));
  }
  case BuildKey::Kind::Target: {
    // Find the target.
    auto it = getBuildDescription().getTargets().find(key.getTargetName());
    if (it == getBuildDescription().getTargets().end()) {
      // FIXME: Invalid target name, produce an error.
      assert(0 && "FIXME: invalid target");
      abort();
    }

    // Create the rule to construct this target.
    Target* target = it->second.get();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [target](BuildEngine& engine) -> Task* {
        return new TargetTask(*target);
      },
      /*IsValid=*/ [target](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
        return TargetTask::isResultValid(
            engine, *target, BuildValue::fromData(value));
      }
    ));
  }
  }

  assert(0 && "invalid key type");
  abort();
}